

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLObjectWrapper.hpp
# Opt level: O0

GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper> * __thiscall
GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper>::operator=
          (GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper> *this,
          GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper> *Wrapper)

{
  GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper> *Wrapper_local;
  GLObjWrapper<GLObjectWrappers::GLFBOCreateReleaseHelper> *this_local;
  
  Release(this);
  this->m_uiHandle = Wrapper->m_uiHandle;
  (this->m_CreateReleaseHelper).m_ExternalFBOHandle =
       (Wrapper->m_CreateReleaseHelper).m_ExternalFBOHandle;
  Diligent::UniqueIdHelper<GLObjectWrappers::GLFBOCreateReleaseHelper>::operator=
            (&this->m_UniqueId,&Wrapper->m_UniqueId);
  Wrapper->m_uiHandle = 0;
  return this;
}

Assistant:

GLObjWrapper& operator=(GLObjWrapper&& Wrapper) noexcept
    {
        Release();

        m_uiHandle            = Wrapper.m_uiHandle;
        m_CreateReleaseHelper = std::move(Wrapper.m_CreateReleaseHelper);
        m_UniqueId            = std::move(Wrapper.m_UniqueId);

        Wrapper.m_uiHandle = 0;

        return *this;
    }